

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O0

int __thiscall Conn::do_recv(Conn *this,ConnInfo *conn_info)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  Buff *this_00;
  size_t sVar3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar7;
  int nrecv;
  Buff *buf;
  ConnInfo *conn_info_local;
  Conn *this_local;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  this_00 = &conn_info->buf;
  sVar3 = Buff::left_size(this_00);
  if (sVar3 == 0) {
    fprintf(_stderr,"%s(%d)-<%s>: sock_fd: %d can read, but buf have no space to read!\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
            ,0x7e,"do_recv",(ulong)(uint)conn_info->fd);
    fflush(_stderr);
    this_local._4_4_ = -3;
  }
  else {
    iVar2 = conn_info->fd;
    pcVar6 = (conn_info->buf)._r_pos;
    sVar3 = Buff::left_size(this_00);
    sVar4 = read(iVar2,pcVar6,sVar3);
    iVar2 = (int)sVar4;
    if (iVar2 < 0) {
      piVar5 = __errno_location();
      __stream = _stderr;
      if (*piVar5 != 0xb) {
        uVar1 = conn_info->fd;
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(__stream,"%s(%d)-<%s>: recv fd %d occurs error, error %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
                ,0x87,"do_recv",(ulong)uVar1,pcVar6);
        fflush(_stderr);
        exit(-2);
      }
      this_local._4_4_ = 0;
    }
    else if (iVar2 == 0) {
      fprintf(_stderr,"%s(%d)-<%s>: recv fd %d, close by client\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x8d,"do_recv",(ulong)(uint)conn_info->fd);
      fflush(_stderr);
      conn_info->readeof = true;
      this_local._4_4_ = -1;
    }
    else {
      fprintf(_stderr,"%s(%d)-<%s>: read done from fd: %d, total nbytes: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x93,"do_recv",(ulong)(uint)conn_info->fd,CONCAT44(uVar7,iVar2));
      fflush(_stderr);
      Buff::set_r_pow(this_00,iVar2);
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Conn::do_recv(ConnInfo *conn_info)
{
    Buff &buf = conn_info->buf;
    // LOG_PRINT("conn_info->buf: %p, conn_info->buf.left_size(): %lu", buf._buf, buf.left_size());
    if (buf.left_size() == 0)
    {
        LOG_PRINT("sock_fd: %d can read, but buf have no space to read!", conn_info->fd);
        return err_svr_recv_nospace;
    }

    int nrecv = read(conn_info->fd, buf._r_pos, buf.left_size());
    if (nrecv < 0)
    {
        if (errno != EAGAIN)    //也就是 EWOULDBLOCK
        {
            LOG_PRINT("recv fd %d occurs error, error %s", conn_info->fd, strerror(errno));
            exit(err_svr_recv_error);
        }
    }
    else if (nrecv == 0)
    {
        LOG_PRINT("recv fd %d, close by client", conn_info->fd);
        conn_info->readeof = true;
        return err_svr_recv_eof;
    }
    else
    {
        LOG_PRINT("read done from fd: %d, total nbytes: %d", conn_info->fd, nrecv);
        buf.set_r_pow(nrecv);
        return err_svr_recv_normal;
    }

    return err_svr_recv_normal;
}